

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

int czhelp_zmsg_readv(zmsg_t *self,char *picture,__va_list_tag *argptr)

{
  byte bVar1;
  undefined2 *puVar2;
  undefined1 *puVar3;
  undefined4 *puVar4;
  int *piVar5;
  double *pdVar6;
  size_t *psVar7;
  undefined1 uVar8;
  undefined2 uVar9;
  undefined4 uVar10;
  int iVar11;
  char *__nptr;
  zframe_t *pzVar12;
  size_t sVar13;
  long lVar14;
  zhashx_t *pzVar16;
  void *__dest;
  zuuid_t *self_00;
  byte *pbVar17;
  undefined8 uVar18;
  undefined8 *puVar19;
  long *plVar20;
  undefined8 *puVar21;
  uint uVar22;
  double dVar23;
  zframe_t *curFrame;
  uint local_5c;
  undefined1 local_58 [32];
  zmsg_t *local_38;
  ulong uVar15;
  
  if (picture == (char *)0x0 || self == (zmsg_t *)0x0) {
    return -1;
  }
  local_5c = 0;
  local_38 = self;
  do {
    bVar1 = *picture;
    if (bVar1 < 0x62) {
      switch(bVar1) {
      case 0x31:
        __nptr = zmsg_popstr(self);
        uVar22 = argptr->gp_offset;
        if ((ulong)uVar22 < 0x29) {
          plVar20 = (long *)((ulong)uVar22 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar22 + 8;
        }
        else {
          plVar20 = (long *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = plVar20 + 1;
        }
        puVar3 = (undefined1 *)*plVar20;
        if (puVar3 != (undefined1 *)0x0) {
          if (__nptr == (char *)0x0) {
            uVar8 = 0;
          }
          else {
            iVar11 = atoi(__nptr);
            uVar8 = (undefined1)iVar11;
          }
          *puVar3 = uVar8;
        }
        break;
      case 0x32:
        __nptr = zmsg_popstr(self);
        uVar22 = argptr->gp_offset;
        if ((ulong)uVar22 < 0x29) {
          plVar20 = (long *)((ulong)uVar22 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar22 + 8;
        }
        else {
          plVar20 = (long *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = plVar20 + 1;
        }
        puVar2 = (undefined2 *)*plVar20;
        if (puVar2 != (undefined2 *)0x0) {
          if (__nptr == (char *)0x0) {
            uVar9 = 0;
          }
          else {
            lVar14 = atol(__nptr);
            uVar9 = (undefined2)lVar14;
          }
          *puVar2 = uVar9;
        }
        break;
      case 0x33:
      case 0x35:
      case 0x36:
      case 0x37:
        goto switchD_0017f3d0_caseD_65;
      case 0x34:
        __nptr = zmsg_popstr(self);
        uVar22 = argptr->gp_offset;
        if ((ulong)uVar22 < 0x29) {
          plVar20 = (long *)((ulong)uVar22 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar22 + 8;
        }
        else {
          plVar20 = (long *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = plVar20 + 1;
        }
        puVar4 = (undefined4 *)*plVar20;
        if (puVar4 != (undefined4 *)0x0) {
          if (__nptr == (char *)0x0) {
            uVar10 = 0;
          }
          else {
            uVar15 = strtoul(__nptr,(char **)0x0,10);
            uVar10 = (undefined4)uVar15;
          }
          *puVar4 = uVar10;
        }
        break;
      case 0x38:
        __nptr = zmsg_popstr(self);
        uVar22 = argptr->gp_offset;
        if ((ulong)uVar22 < 0x29) {
          plVar20 = (long *)((ulong)uVar22 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar22 + 8;
        }
        else {
          plVar20 = (long *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = plVar20 + 1;
        }
        plVar20 = (long *)*plVar20;
        if (plVar20 != (long *)0x0) {
          if (__nptr == (char *)0x0) {
            lVar14 = 0;
          }
          else {
            iVar11 = atoi(__nptr);
            lVar14 = (long)iVar11;
          }
          *plVar20 = lVar14;
        }
        break;
      default:
        if (bVar1 == 0x55) {
          local_58._0_8_ = zmsg_pop(self);
          uVar22 = argptr->gp_offset;
          if ((ulong)uVar22 < 0x29) {
            puVar19 = (undefined8 *)((ulong)uVar22 + (long)argptr->reg_save_area);
            argptr->gp_offset = uVar22 + 8;
          }
          else {
            puVar19 = (undefined8 *)argptr->overflow_arg_area;
            argptr->overflow_arg_area = puVar19 + 1;
          }
          puVar19 = (undefined8 *)*puVar19;
          if (puVar19 != (undefined8 *)0x0) {
            if ((zframe_t *)local_58._0_8_ == (zframe_t *)0x0) {
              *puVar19 = 0;
            }
            else {
              self_00 = zuuid_new();
              *puVar19 = self_00;
              pbVar17 = zframe_data((zframe_t *)local_58._0_8_);
              zuuid_set(self_00,pbVar17);
            }
          }
          goto LAB_0017fa2e;
        }
        if (bVar1 == 0) {
          return local_5c;
        }
        goto switchD_0017f3d0_caseD_65;
      }
      goto LAB_0017f9e8;
    }
    switch(bVar1) {
    case 0x62:
      local_58._0_8_ = zmsg_pop(self);
      uVar22 = argptr->gp_offset;
      if ((ulong)uVar22 < 0x29) {
        puVar19 = (undefined8 *)((ulong)uVar22 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar22 + 8;
      }
      else {
        puVar19 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar19 + 1;
      }
      puVar19 = (undefined8 *)*puVar19;
      uVar22 = argptr->gp_offset;
      if ((ulong)uVar22 < 0x29) {
        puVar21 = (undefined8 *)((ulong)uVar22 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar22 + 8;
      }
      else {
        puVar21 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar21 + 1;
      }
      if (puVar19 != (undefined8 *)0x0) {
        psVar7 = (size_t *)*puVar21;
        if ((zframe_t *)local_58._0_8_ == (zframe_t *)0x0) {
          *puVar19 = 0;
          *psVar7 = 0;
        }
        else {
          sVar13 = zframe_size((zframe_t *)local_58._0_8_);
          *psVar7 = sVar13;
          __dest = malloc(sVar13);
          *puVar19 = __dest;
          pbVar17 = zframe_data((zframe_t *)local_58._0_8_);
          memcpy(__dest,pbVar17,*psVar7);
        }
      }
      zframe_destroy((zframe_t **)local_58);
      self = local_38;
      break;
    case 99:
      local_58._0_8_ = zmsg_pop(self);
      uVar22 = argptr->gp_offset;
      if ((ulong)uVar22 < 0x29) {
        plVar20 = (long *)((ulong)uVar22 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar22 + 8;
      }
      else {
        plVar20 = (long *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = plVar20 + 1;
      }
      puVar19 = (undefined8 *)*plVar20;
      if (puVar19 != (undefined8 *)0x0) {
        if ((zframe_t *)local_58._0_8_ == (zframe_t *)0x0) {
LAB_0017f942:
          pzVar16 = (zhashx_t *)0x0;
        }
        else {
          pbVar17 = zframe_data((zframe_t *)local_58._0_8_);
          sVar13 = zframe_size((zframe_t *)local_58._0_8_);
          pzVar16 = (zhashx_t *)zchunk_new(pbVar17,sVar13);
        }
LAB_0017f944:
        *puVar19 = pzVar16;
      }
      goto LAB_0017fa2e;
    case 100:
      __nptr = zmsg_popstr(self);
      uVar22 = argptr->gp_offset;
      if ((ulong)uVar22 < 0x29) {
        plVar20 = (long *)((ulong)uVar22 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar22 + 8;
      }
      else {
        plVar20 = (long *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = plVar20 + 1;
      }
      pdVar6 = (double *)*plVar20;
      if (pdVar6 != (double *)0x0) {
        if (__nptr == (char *)0x0) {
          dVar23 = 0.0;
        }
        else {
          dVar23 = strtod(__nptr,(char **)0x0);
        }
        *pdVar6 = dVar23;
      }
      goto LAB_0017f9e8;
    default:
      goto switchD_0017f3d0_caseD_65;
    case 0x66:
      pzVar12 = zmsg_pop(self);
      uVar22 = argptr->gp_offset;
      if ((ulong)uVar22 < 0x29) {
        plVar20 = (long *)((ulong)uVar22 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar22 + 8;
      }
      else {
        plVar20 = (long *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = plVar20 + 1;
      }
      puVar19 = (undefined8 *)*plVar20;
      local_58._0_8_ = pzVar12;
      if (puVar19 == (undefined8 *)0x0) goto LAB_0017fa2e;
LAB_0017f89c:
      *puVar19 = pzVar12;
      break;
    case 0x68:
      local_58._0_8_ = zmsg_pop(self);
      uVar22 = argptr->gp_offset;
      if ((ulong)uVar22 < 0x29) {
        plVar20 = (long *)((ulong)uVar22 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar22 + 8;
      }
      else {
        plVar20 = (long *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = plVar20 + 1;
      }
      puVar19 = (undefined8 *)*plVar20;
      if (puVar19 != (undefined8 *)0x0) {
        if ((zframe_t *)local_58._0_8_ == (zframe_t *)0x0) goto LAB_0017f942;
        pzVar16 = zhashx_unpack((zframe_t *)local_58._0_8_);
        goto LAB_0017f944;
      }
      goto LAB_0017fa2e;
    case 0x69:
      __nptr = zmsg_popstr(self);
      uVar22 = argptr->gp_offset;
      if ((ulong)uVar22 < 0x29) {
        plVar20 = (long *)((ulong)uVar22 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar22 + 8;
      }
      else {
        plVar20 = (long *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = plVar20 + 1;
      }
      piVar5 = (int *)*plVar20;
      if (piVar5 != (int *)0x0) {
        if (__nptr == (char *)0x0) {
          iVar11 = 0;
        }
        else {
          iVar11 = atoi(__nptr);
        }
        *piVar5 = iVar11;
      }
LAB_0017f9e8:
      free(__nptr);
      break;
    case 0x6e:
      uVar22 = argptr->gp_offset;
      if ((ulong)uVar22 < 0x29) {
        puVar19 = (undefined8 *)((ulong)uVar22 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar22 + 8;
      }
      else {
        puVar19 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar19 + 1;
      }
      plVar20 = (long *)*puVar19;
      binarydata::binarydata((binarydata *)local_58);
      CZHelp::zmsg_popNDT(self,(binarydata *)local_58);
      (**(code **)(*plVar20 + 0x18))(plVar20);
      if ((zframe_t *)local_58._0_8_ != (zframe_t *)(local_58 + 0x10)) {
        operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
      }
      break;
    case 0x70:
      local_58._0_8_ = zmsg_pop(self);
      uVar22 = argptr->gp_offset;
      if ((ulong)uVar22 < 0x29) {
        plVar20 = (long *)((ulong)uVar22 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar22 + 8;
      }
      else {
        plVar20 = (long *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = plVar20 + 1;
      }
      puVar19 = (undefined8 *)*plVar20;
      uVar22 = local_5c;
      if (puVar19 != (undefined8 *)0x0) {
        if ((zframe_t *)local_58._0_8_ == (zframe_t *)0x0) {
          uVar18 = 0;
        }
        else {
          sVar13 = zframe_size((zframe_t *)local_58._0_8_);
          uVar22 = 0xffffffff;
          if (sVar13 != 8) goto LAB_0017fa18;
          pbVar17 = zframe_data((zframe_t *)local_58._0_8_);
          uVar18 = *(undefined8 *)pbVar17;
        }
        *puVar19 = uVar18;
        uVar22 = local_5c;
      }
LAB_0017fa18:
      zframe_destroy((zframe_t **)local_58);
      local_5c = uVar22;
      break;
    case 0x73:
      pzVar12 = (zframe_t *)zmsg_popstr(self);
      uVar22 = argptr->gp_offset;
      if ((ulong)uVar22 < 0x29) {
        plVar20 = (long *)((ulong)uVar22 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar22 + 8;
      }
      else {
        plVar20 = (long *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = plVar20 + 1;
      }
      puVar19 = (undefined8 *)*plVar20;
      if (puVar19 != (undefined8 *)0x0) goto LAB_0017f89c;
      break;
    case 0x7a:
      local_58._0_8_ = zmsg_pop(self);
      if ((zframe_t *)local_58._0_8_ != (zframe_t *)0x0) {
        sVar13 = zframe_size((zframe_t *)local_58._0_8_);
        local_5c = local_5c | -(uint)(sVar13 != 0);
      }
LAB_0017fa2e:
      zframe_destroy((zframe_t **)local_58);
    }
LAB_0017fa36:
    picture = (char *)((byte *)picture + 1);
  } while( true );
switchD_0017f3d0_caseD_65:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ERROR: formated data type not supported. (CZHelp::zmsg_read)\n",
             0x3d);
  goto LAB_0017fa36;
}

Assistant:

int czhelp_zmsg_readv(zmsg_t* self, const char* picture, va_list argptr) {
    int retval = -1;
    if (self == NULL || picture == NULL)
        return(retval);
    retval = 0;
    while(*picture) {
        if (*picture == 'i') { //int
            char *str = zmsg_popstr(self);
            int *val = va_arg(argptr, int *); //retrieve int from the input list of argumetns
            if (val)
                *val = str? atoi (str): 0;
            freen(str);

        }
        else if (*picture == '1') { //uint8_t
            char *str = zmsg_popstr (self);
            uint8_t *val = va_arg (argptr, uint8_t *);
            if (val)
                *val = str? (uint8_t) atoi (str): 0;
            freen(str);
        }
        else if (*picture == '2') { //uint16_t
            char *str = zmsg_popstr (self);
            uint16_t *val = va_arg (argptr, uint16_t *);
            if (val)
                *val = str? (uint16_t) atol (str): 0;
            freen(str);
        }
        else if (*picture == '4') { //uint32_t
            char *str = zmsg_popstr (self);
            uint32_t *val = va_arg (argptr, uint32_t *);
            if (val)
                *val = str? (uint32_t) strtoul(str, NULL, 10): 0;
            freen(str);
        }
        else if (*picture == '8') { //uint64_t
            char *str = zmsg_popstr (self);
            uint64_t *val = va_arg (argptr, uint64_t *);
            if (val)
                *val = str? (uint64_t) atoi (str): 0;
            freen(str);
        }
        else if (*picture == 'd') {
            char *str = zmsg_popstr(self);
            double *val = va_arg(argptr, double *);
            if (val)
                *val = str ? (double) strtod(str, NULL) : 0;
            freen(str);
        }
        else if (*picture == 's') { //string
            char *str = zmsg_popstr(self);
            char **val = va_arg(argptr, char **);
            if (val) {
                *val = str;
            }
        }
        else if (*picture == 'b') { //byte *, size_t (2 args)
            zframe_t *curFrame = zmsg_pop (self);
            byte **data_p = va_arg (argptr, byte **);
            size_t *size = va_arg (argptr, size_t *);
            if (data_p) {
                if (curFrame) {
                    *size = zframe_size (curFrame);
                    *data_p = (byte *) malloc (*size);
                    memcpy (*data_p, zframe_data (curFrame), *size);
                }
                else {
                    *data_p = NULL;
                    *size = 0;
                }
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'c') { //zchunk_t *
            zframe_t *curFrame = zmsg_pop (self);
            zchunk_t **val = va_arg (argptr, zchunk_t **);
            if (val) {
                if (curFrame)
                    *val = zchunk_new (zframe_data (curFrame), zframe_size (curFrame));
                else
                    *val = NULL;
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'f') { //zframe_t *
            zframe_t *curFrame = zmsg_pop (self);
            zframe_t **val = va_arg (argptr, zframe_t **);
            if (val)
                *val = curFrame;
            else
                zframe_destroy (&curFrame);
        }
        else if (*picture == 'U') { //zuuid_t *
            zframe_t *curFrame = zmsg_pop (self);
            zuuid_t **val = va_arg (argptr, zuuid_t **);
            if (val) {
                if (curFrame) {
                    *val = zuuid_new ();
                    zuuid_set (*val, zframe_data (curFrame));
                }
                else
                    *val = NULL;
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'p') { //void *
            zframe_t *curFrame = zmsg_pop (self);
            void **val = va_arg (argptr, void **);
            if (val) {
                if (curFrame) {
                    if (zframe_size (curFrame) == sizeof (void *))
                        *val = *((void **) zframe_data (curFrame));
                    else
                        retval = -1;
                }
                else
                    *val = NULL;
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'h') { //zhashx_t *
            zframe_t *curFrame = zmsg_pop (self);
            zhashx_t **val = va_arg (argptr, zhashx_t **);
            if (val) {
                if (curFrame)
                    *val = zhashx_unpack (curFrame);
                else
                    *val = NULL;
            }
            zframe_destroy (&curFrame);
        }
        else if (*picture == 'n') { //NetworkDataType
            NetworkDataType *val = va_arg(argptr, NetworkDataType *);
            binarydata dat;
            CZHelp::zmsg_popNDT(self, dat);
            val->decode(dat);
        }
        else if (*picture == 'z') { //sends zero-frame (0 args)
            zframe_t *curFrame = zmsg_pop (self);
            if (curFrame && zframe_size (curFrame) != 0)
                retval = -1;
            zframe_destroy (&curFrame);
        }
        else {
            std::cout << "ERROR: formated data type not supported. (CZHelp::zmsg_read)\n";
        }
        picture++;
    }
    return(retval);
}